

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8d_vdpu2.c
# Opt level: O2

MPP_RET hal_vp8d_vdpu2_gen_regs(void *hal,HalTaskInfo *task)

{
  uint *puVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  RK_U32 RVar6;
  void *pvVar7;
  undefined1 *puVar8;
  undefined1 *puVar9;
  long lVar10;
  undefined1 *puVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  uint *puVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  bool bVar27;
  MppBuffer framebuf;
  uint *local_48;
  uint *local_40;
  MppBuffer local_38;
  
  framebuf = (MppBuffer)0x0;
  pvVar2 = *(void **)((long)hal + 0x18);
  pvVar3 = (task->dec).syntax.data;
  pvVar7 = pvVar2;
  if ((hal_vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x1c4,
               "hal_vp8d_vdpu2_gen_regs");
    pvVar7 = *(void **)((long)hal + 0x18);
    if ((hal_vp8d_debug & 1) != 0) {
      _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0xa6,
                 "hal_vp8_init_hwcfg");
    }
  }
  memset(pvVar7,0,0x27c);
  *(undefined8 *)((long)pvVar7 + 0xd4) = 0x3f0000000a;
  *(undefined8 *)((long)pvVar7 + 0xe0) = 0x3000100000;
  iVar4 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)((long)hal + 0x38),"hal_vp8_init_hwcfg");
  *(int *)((long)pvVar7 + 0x254) = iVar4;
  iVar4 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)((long)hal + 0x30),"hal_vp8_init_hwcfg");
  *(int *)((long)pvVar7 + 0xf4) = iVar4;
  if ((hal_vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0xc4,
               "hal_vp8_init_hwcfg");
  }
  uVar5 = *(int *)((long)pvVar3 + 4) + 0xf;
  uVar25 = uVar5 >> 4;
  uVar16 = *(int *)((long)pvVar3 + 8) + 0xf;
  *(uint *)((long)pvVar2 + 0x1e0) =
       uVar16 >> 0xc & 7 |
       uVar5 >> 10 & 0x38 |
       (uVar16 & 0xff0) << 7 | *(uint *)((long)pvVar2 + 0x1e0) & 0x7807c0 | uVar25 << 0x17;
  if (((*(byte *)((long)pvVar3 + 0xd) & 1) == 0) &&
     (pvVar7 = mpp_buffer_get_ptr_with_caller
                         (*(MppBuffer *)((long)hal + 0x38),"hal_vp8d_vdpu2_gen_regs"),
     pvVar7 != (void *)0x0)) {
    memset(pvVar7,0,0xc00);
  }
  puVar8 = (undefined1 *)
           mpp_buffer_get_ptr_with_caller
                     (*(MppBuffer *)((long)hal + 0x30),"hal_vp8d_vdpu2_gen_regs");
  if (puVar8 != (undefined1 *)0x0) {
    if ((hal_vp8d_debug & 1) != 0) {
      _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x15d,
                 "hal_vp8hw_asic_probe_update");
    }
    *puVar8 = *(undefined1 *)((long)pvVar3 + 0x455);
    puVar8[1] = *(undefined1 *)((long)pvVar3 + 0x457);
    puVar8[2] = *(undefined1 *)((long)pvVar3 + 0x458);
    puVar8[3] = *(undefined1 *)((long)pvVar3 + 0x459);
    puVar8[4] = *(undefined1 *)((long)pvVar3 + 0x17);
    puVar8[5] = *(undefined1 *)((long)pvVar3 + 0x18);
    puVar8[6] = *(undefined1 *)((long)pvVar3 + 0x19);
    puVar8[7] = 0;
    puVar8[8] = *(undefined1 *)((long)pvVar3 + 0x45a);
    puVar8[9] = *(undefined1 *)((long)pvVar3 + 0x45b);
    puVar8[10] = *(undefined1 *)((long)pvVar3 + 0x45c);
    puVar8[0xb] = *(undefined1 *)((long)pvVar3 + 0x45d);
    puVar8[0xc] = *(undefined1 *)((long)pvVar3 + 0x45e);
    puVar8[0xd] = *(undefined1 *)((long)pvVar3 + 0x45f);
    puVar8[0xe] = *(undefined1 *)((long)pvVar3 + 0x460);
    puVar8[0xf] = 0;
    puVar8[0x10] = *(undefined1 *)((long)pvVar3 + 0x461);
    puVar8[0x11] = *(undefined1 *)((long)pvVar3 + 0x474);
    puVar8[0x12] = *(undefined1 *)((long)pvVar3 + 0x462);
    puVar8[0x13] = *(undefined1 *)((long)pvVar3 + 0x475);
    puVar8[0x14] = *(undefined1 *)((long)pvVar3 + 0x472);
    puVar8[0x15] = *(undefined1 *)((long)pvVar3 + 0x473);
    puVar8[0x16] = *(undefined1 *)((long)pvVar3 + 0x485);
    puVar8[0x17] = *(undefined1 *)((long)pvVar3 + 0x486);
    puVar9 = puVar8 + 0x18;
    lVar14 = (long)pvVar3 + 0x46d;
    for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
      for (uVar18 = 0; uVar18 < 8; uVar18 = uVar18 + 4) {
        puVar9[uVar18] = *(undefined1 *)(lVar14 + -3 + uVar18);
        puVar9[uVar18 + 1] = *(undefined1 *)(lVar14 + -2 + uVar18);
        puVar9[uVar18 + 2] = *(undefined1 *)(lVar14 + -1 + uVar18);
        puVar9[uVar18 + 3] = *(undefined1 *)(lVar14 + uVar18);
      }
      lVar14 = lVar14 + 0x13;
      puVar9 = puVar9 + uVar18;
    }
    puVar11 = (undefined1 *)((long)pvVar3 + 0x469);
    for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
      puVar9[lVar14 * 8] = puVar11[-6];
      puVar9[lVar14 * 8 + 1] = puVar11[-5];
      puVar9[lVar14 * 8 + 2] = puVar11[-4];
      puVar9[lVar14 * 8 + 3] = puVar11[-3];
      puVar9[lVar14 * 8 + 4] = puVar11[-2];
      puVar9[lVar14 * 8 + 5] = puVar11[-1];
      puVar9[lVar14 * 8 + 6] = *puVar11;
      puVar9[lVar14 * 8 + 7] = 0;
      puVar11 = puVar11 + 0x13;
    }
    puVar9 = puVar8 + 0x38;
    lVar14 = (long)pvVar3 + 0x38;
    for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
      lVar19 = lVar14;
      for (lVar21 = 0; lVar21 != 8; lVar21 = lVar21 + 1) {
        for (lVar23 = 0; lVar23 != 0x21; lVar23 = lVar23 + 0xb) {
          *puVar9 = *(undefined1 *)(lVar19 + -3 + lVar23);
          puVar9[1] = *(undefined1 *)(lVar19 + -2 + lVar23);
          puVar9[2] = *(undefined1 *)(lVar19 + -1 + lVar23);
          puVar9[3] = *(undefined1 *)(lVar19 + lVar23);
          puVar9 = puVar9 + 4;
        }
        lVar19 = lVar19 + 0x21;
      }
      lVar14 = lVar14 + 0x108;
    }
    puVar8 = puVar8 + 0x1b8;
    lVar14 = (long)pvVar3 + 0x3f;
    for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
      lVar19 = lVar14;
      for (lVar21 = 0; lVar21 != 8; lVar21 = lVar21 + 1) {
        for (lVar23 = 0; lVar23 != 0x21; lVar23 = lVar23 + 0xb) {
          *puVar8 = *(undefined1 *)(lVar19 + -6 + lVar23);
          puVar8[1] = *(undefined1 *)(lVar19 + -5 + lVar23);
          puVar8[2] = *(undefined1 *)(lVar19 + -4 + lVar23);
          puVar8[3] = *(undefined1 *)(lVar19 + -3 + lVar23);
          puVar8[4] = *(undefined1 *)(lVar19 + -2 + lVar23);
          puVar8[5] = *(undefined1 *)(lVar19 + -1 + lVar23);
          puVar8[6] = *(undefined1 *)(lVar19 + lVar23);
          puVar8[7] = 0;
          puVar8 = puVar8 + 8;
        }
        lVar19 = lVar19 + 0x21;
      }
      lVar14 = lVar14 + 0x108;
    }
    if ((hal_vp8d_debug & 1) != 0) {
      _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x1b5,
                 "hal_vp8hw_asic_probe_update");
    }
  }
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)hal + 8),*(byte *)((long)pvVar3 + 0xc) & 0x7f,SLOT_BUFFER,
             &framebuf);
  iVar4 = mpp_buffer_get_fd_with_caller(framebuf,"hal_vp8d_vdpu2_gen_regs");
  *(int *)((long)pvVar2 + 0xfc) = iVar4;
  if ((*(byte *)((long)pvVar3 + 0xd) & 1) == 0) {
    *(int *)((long)pvVar2 + 0x20c) = iVar4;
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),0x83,(uVar16 >> 4) * uVar25);
  }
  else {
    uVar5 = *(byte *)((long)pvVar3 + 0x31) & 0x7f;
    if (uVar5 != 0x7f) {
      mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 8),uVar5,SLOT_BUFFER,&framebuf);
      iVar4 = mpp_buffer_get_fd_with_caller(framebuf,"hal_vp8d_vdpu2_gen_regs");
    }
    *(int *)((long)pvVar2 + 0x20c) = iVar4;
  }
  uVar5 = *(byte *)((long)pvVar3 + 0x30) & 0x7f;
  if (uVar5 == 0x7f) {
    iVar4 = *(int *)((long)pvVar2 + 0xfc);
  }
  else {
    mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 8),uVar5,SLOT_BUFFER,&framebuf);
    iVar4 = mpp_buffer_get_fd_with_caller(framebuf,"hal_vp8d_vdpu2_gen_regs");
  }
  *(int *)((long)pvVar2 + 0x220) = iVar4;
  if (*(byte *)((long)pvVar3 + 0x32) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),0x88,(uint)*(byte *)((long)pvVar3 + 0x32));
  }
  uVar5 = *(byte *)((long)pvVar3 + 0x2f) & 0x7f;
  if (uVar5 == 0x7f) {
    iVar4 = *(int *)((long)pvVar2 + 0xfc);
  }
  else {
    mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 8),uVar5,SLOT_BUFFER,&framebuf);
    iVar4 = mpp_buffer_get_fd_with_caller(framebuf,"hal_vp8d_vdpu2_gen_regs");
  }
  *(int *)((long)pvVar2 + 0x224) = iVar4;
  if (*(byte *)((long)pvVar3 + 0x33) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),0x89,(uint)*(byte *)((long)pvVar3 + 0x33));
  }
  if ((*(byte *)((long)pvVar3 + 0xe) & 3) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),0x95,*(byte *)((long)pvVar3 + 0xe) & 3);
  }
  *(uint *)((long)pvVar2 + 0xe4) =
       *(uint *)((long)pvVar2 + 0xe4) & 0xffffbfff | (*(byte *)((long)pvVar3 + 0xd) & 1) << 0xe;
  uVar5 = *(uint *)((long)pvVar2 + 200) & 0xfffffdff |
          (uint)(*(char *)((long)pvVar3 + 0x456) == '\0') << 9;
  *(uint *)((long)pvVar2 + 200) = uVar5;
  if ((*(byte *)((long)pvVar3 + 0xe) & 1) == 0) {
    *(uint *)((long)pvVar2 + 0x204) =
         *(uint *)((long)pvVar2 + 0x204) & 0xff03ffff |
         (*(byte *)((long)pvVar3 + 0x1b) & 0x3f) << 0x12;
  }
  else {
    if ((*(byte *)((long)pvVar3 + 0xe) & 4) == 0) {
      uVar16 = (int)*(char *)((long)pvVar3 + 0x13) + (uint)*(byte *)((long)pvVar3 + 0x1b);
      uVar25 = 0xfc0000;
      if (uVar16 < 0x40) {
        uVar25 = uVar16 * 0x40000;
      }
      if ((int)uVar16 < 0) {
        uVar25 = 0;
      }
      uVar12 = *(uint *)((long)pvVar2 + 0x204);
      *(uint *)((long)pvVar2 + 0x204) = uVar12 & 0xff03ffff | uVar25;
      uVar16 = (int)*(char *)((long)pvVar3 + 0x14) + (uint)*(byte *)((long)pvVar3 + 0x1b);
      uVar13 = 0x3f000;
      if (uVar16 < 0x40) {
        uVar13 = uVar16 * 0x1000;
      }
      if ((int)uVar16 < 0) {
        uVar13 = 0;
      }
      *(uint *)((long)pvVar2 + 0x204) = uVar12 & 0xff000fff | uVar25 | uVar13;
      uVar16 = (int)*(char *)((long)pvVar3 + 0x15) + (uint)*(byte *)((long)pvVar3 + 0x1b);
      uVar20 = 0xfc0;
      if (uVar16 < 0x40) {
        uVar20 = uVar16 * 0x40;
      }
      if ((int)uVar16 < 0) {
        uVar20 = 0;
      }
      *(uint *)((long)pvVar2 + 0x204) = uVar12 & 0xff00003f | uVar25 | uVar13 | uVar20;
      uVar22 = (int)*(char *)((long)pvVar3 + 0x16) + (uint)*(byte *)((long)pvVar3 + 0x1b);
      uVar16 = 0x3f;
      if ((int)uVar22 < 0x40) {
        uVar16 = uVar22 & 0x3f;
      }
      if ((int)uVar22 < 0) {
        uVar16 = 0;
      }
      uVar16 = uVar12 & 0xff000000 | uVar25 | uVar13 | uVar20 | uVar16;
    }
    else {
      uVar16 = *(uint *)((long)pvVar2 + 0x204);
      uVar25 = (*(byte *)((long)pvVar3 + 0x13) & 0x3f) << 0x12;
      *(uint *)((long)pvVar2 + 0x204) = uVar16 & 0xff03ffff | uVar25;
      uVar12 = (*(byte *)((long)pvVar3 + 0x14) & 0x3f) << 0xc;
      *(uint *)((long)pvVar2 + 0x204) = uVar16 & 0xff000fff | uVar25 | uVar12;
      uVar13 = (*(byte *)((long)pvVar3 + 0x15) & 0x3f) << 6;
      *(uint *)((long)pvVar2 + 0x204) = uVar16 & 0xff00003f | uVar25 | uVar12 | uVar13;
      uVar16 = uVar16 & 0xff000000 | uVar25 | uVar12 | uVar13 |
               *(byte *)((long)pvVar3 + 0x16) & 0x3f;
    }
    *(uint *)((long)pvVar2 + 0x204) = uVar16;
  }
  uVar25 = (uint)*(byte *)((long)pvVar3 + 0x1a) << 0x1f;
  uVar16 = *(uint *)((long)pvVar2 + 0x210);
  *(uint *)((long)pvVar2 + 0x210) = uVar16 & 0x7fffffff | uVar25;
  uVar12 = (*(byte *)((long)pvVar3 + 0x1c) & 7) << 0x1c;
  *(uint *)((long)pvVar2 + 0x210) = uVar16 & 0xfffffff | uVar25 | uVar12;
  if (*(char *)((long)pvVar3 + 0x1b) == '\0') {
    *(uint *)((long)pvVar2 + 200) = uVar5 | 0x100;
  }
  if ((*(byte *)((long)pvVar3 + 0xd) & 0xe) != 6) {
    *(byte *)((long)pvVar2 + 0x1e5) = *(byte *)((long)pvVar2 + 0x1e5) | 0x20;
  }
  if ((*(int *)((long)pvVar3 + 0x488) == 2) && ((*(byte *)((long)pvVar3 + 0xd) & 6) != 0)) {
    *(byte *)((long)pvVar2 + 0x1e5) = *(byte *)((long)pvVar2 + 0x1e5) | 0x10;
  }
  uVar5 = *(uint *)((long)pvVar2 + 0x1e8) & 0xffff00ff |
          (*(uint *)((long)pvVar3 + 0x48c) & 0xff) << 8;
  *(uint *)((long)pvVar2 + 0x1e8) = uVar5;
  *(uint *)((long)pvVar2 + 0x1e8) =
       CONCAT31((int3)(uVar5 >> 8),*(undefined1 *)((long)pvVar3 + 0x490));
  if ((*(byte *)((long)pvVar3 + 0xe) & 1) == 0) {
    uVar13 = *(uint *)((long)pvVar2 + 0x208) & 0xffc007ff |
             ((int)*(char *)((long)pvVar3 + 0x2a) & 0x7ffU) << 0xb;
    *(uint *)((long)pvVar2 + 0x208) = uVar13;
    uVar5 = *(uint *)((long)pvVar2 + 0x25c);
  }
  else {
    if ((*(byte *)((long)pvVar3 + 0xe) & 4) == 0) {
      uVar5 = (int)*(char *)((long)pvVar3 + 0xf) + (int)*(char *)((long)pvVar3 + 0x2a);
      uVar20 = uVar5 * 0x800;
      if (0x7f < uVar5) {
        uVar20 = 0x3f800;
      }
      if ((int)uVar5 < 0) {
        uVar20 = 0;
      }
      uVar5 = *(uint *)((long)pvVar2 + 0x208);
      *(uint *)((long)pvVar2 + 0x208) = uVar5 & 0xffc007ff | uVar20;
      uVar22 = (int)*(char *)((long)pvVar3 + 0x10) + (int)*(char *)((long)pvVar3 + 0x2a);
      uVar13 = uVar22 & 0x7ff;
      if (0x7f < (int)uVar22) {
        uVar13 = 0x7f;
      }
      if ((int)uVar22 < 0) {
        uVar13 = 0;
      }
      uVar13 = uVar5 & 0xffc00000 | uVar20 | uVar13;
      *(uint *)((long)pvVar2 + 0x208) = uVar13;
      uVar5 = (int)*(char *)((long)pvVar3 + 0x11) + (int)*(char *)((long)pvVar3 + 0x2a);
      uVar20 = uVar5 * 0x800;
      if (0x7f < uVar5) {
        uVar20 = 0x3f800;
      }
      if ((int)uVar5 < 0) {
        uVar20 = 0;
      }
      uVar22 = *(uint *)((long)pvVar2 + 0x25c);
      *(uint *)((long)pvVar2 + 0x25c) = uVar22 & 0xffc007ff | uVar20;
      uVar24 = (int)*(char *)((long)pvVar3 + 0x12) + (int)*(char *)((long)pvVar3 + 0x2a);
      uVar5 = uVar24 & 0x7ff;
      if (0x7f < (int)uVar24) {
        uVar5 = 0x7f;
      }
      if ((int)uVar24 < 0) {
        uVar5 = 0;
      }
      uVar5 = uVar22 & 0xffc00000 | uVar20 | uVar5;
    }
    else {
      uVar13 = ((int)*(char *)((long)pvVar3 + 0xf) & 0x7ffU) << 0xb;
      uVar5 = *(uint *)((long)pvVar2 + 0x208);
      *(uint *)((long)pvVar2 + 0x208) = uVar5 & 0xffc007ff | uVar13;
      uVar13 = uVar5 & 0xffc00000 | uVar13 | (int)*(char *)((long)pvVar3 + 0x10) & 0x7ffU;
      *(uint *)((long)pvVar2 + 0x208) = uVar13;
      uVar5 = *(uint *)((long)pvVar2 + 0x25c);
      uVar20 = ((int)*(char *)((long)pvVar3 + 0x11) & 0x7ffU) << 0xb;
      *(uint *)((long)pvVar2 + 0x25c) = uVar5 & 0xffc007ff | uVar20;
      uVar5 = uVar5 & 0xffc00000 | uVar20 | (int)*(char *)((long)pvVar3 + 0x12) & 0x7ffU;
    }
    *(uint *)((long)pvVar2 + 0x25c) = uVar5;
  }
  uVar20 = (uint)*(byte *)((long)pvVar3 + 0x29) << 0x1b;
  *(uint *)((long)pvVar2 + 0x208) = uVar13 & 0x7ffffff | uVar20;
  *(uint *)((long)pvVar2 + 0x208) =
       uVar13 & 0x3fffff | uVar20 | (*(byte *)((long)pvVar3 + 0x2b) & 0x1f) << 0x16;
  uVar13 = *(int *)((long)pvVar3 + 0x2c) << 0x1b;
  *(uint *)((long)pvVar2 + 0x25c) = uVar5 & 0x7ffffff | uVar13;
  *(uint *)((long)pvVar2 + 0x25c) =
       uVar5 & 0x3fffff | uVar13 | (*(byte *)((long)pvVar3 + 0x2d) & 0x1f) << 0x16;
  *(uint *)((long)pvVar2 + 0x260) =
       *(uint *)((long)pvVar2 + 0x260) & 0x7ffffff | (uint)*(byte *)((long)pvVar3 + 0x2e) << 0x1b;
  if (*(char *)((long)pvVar3 + 0x1d) != '\0') {
    uVar13 = (*(byte *)((long)pvVar3 + 0x1f) & 0x7f) << 0x15;
    uVar5 = *(uint *)((long)pvVar2 + 0x214);
    *(uint *)((long)pvVar2 + 0x214) = uVar5 & 0xf01fffff | uVar13;
    uVar20 = (*(byte *)((long)pvVar3 + 0x20) & 0x7f) << 0xe;
    *(uint *)((long)pvVar2 + 0x214) = uVar5 & 0xf0003fff | uVar13 | uVar20;
    uVar22 = (*(byte *)((long)pvVar3 + 0x21) & 0x7f) << 7;
    *(uint *)((long)pvVar2 + 0x214) = uVar5 & 0xf000007f | uVar13 | uVar20 | uVar22;
    *(uint *)((long)pvVar2 + 0x214) =
         uVar5 & 0xf0000000 | uVar13 | uVar20 | uVar22 | *(byte *)((long)pvVar3 + 0x22) & 0x7f;
    uVar20 = (*(byte *)((long)pvVar3 + 0x23) & 0x7f) << 0x15;
    *(uint *)((long)pvVar2 + 0x210) = uVar16 & 0x1fffff | uVar25 | uVar12 | uVar20;
    uVar5 = (*(byte *)((long)pvVar3 + 0x24) & 0x7f) << 0xe;
    *(uint *)((long)pvVar2 + 0x210) = uVar16 & 0x3fff | uVar25 | uVar12 | uVar20 | uVar5;
    uVar13 = (*(byte *)((long)pvVar3 + 0x25) & 0x7f) << 7;
    *(uint *)((long)pvVar2 + 0x210) = uVar16 & 0x7f | uVar25 | uVar12 | uVar20 | uVar5 | uVar13;
    *(uint *)((long)pvVar2 + 0x210) =
         uVar25 | uVar12 | uVar20 | uVar5 | uVar13 | *(byte *)((long)pvVar3 + 0x26) & 0x7f;
  }
  RVar6 = hal_vp8d_debug;
  if ((*(byte *)((long)pvVar3 + 0xd) & 6) == 0) {
    lVar14 = *(long *)((long)hal + 0x18);
    bVar27 = true;
    if ((hal_vp8d_debug & 1) != 0) {
      _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0xcc,
                 "hal_vp8d_pre_filter_tap_set");
      bVar27 = (hal_vp8d_debug & 1) == 0;
    }
    RVar6 = hal_vp8d_debug;
    *(uint *)(lVar14 + 0xec) = *(uint *)(lVar14 + 0xec) & 3 | 0x80000;
    *(uint *)(lVar14 + 0x264) = *(uint *)(lVar14 + 0x264) & 3 | 0x3fa1ec;
    *(uint *)(lVar14 + 0x268) = *(uint *)(lVar14 + 0x268) & 3 | 0x33fffd4;
    *(uint *)(lVar14 + 0x26c) = *(uint *)(lVar14 + 0x26c) & 3 | 0x1b024fe0;
    *(uint *)(lVar14 + 0x270) = *(uint *)(lVar14 + 0x270) & 3 | 0xfdc5d0c8;
    *(ulong *)(lVar14 + 0x274) = *(ulong *)(lVar14 + 0x274) & 0x300000003 | (ulong)DAT_00292a10;
    *(ulong *)(lVar14 + 500) = *(ulong *)(lVar14 + 500) & 0x300000003 | (ulong)DAT_00292a20;
    *(uint *)(lVar14 + 0x1fc) = *(uint *)(lVar14 + 0x1fc) & 3 | 0xfd7ff030;
    *(undefined4 *)(lVar14 + 0x200) = 0x1effa9f6;
    if (!bVar27) {
      _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0xf9,
                 "hal_vp8d_pre_filter_tap_set");
      RVar6 = hal_vp8d_debug;
    }
  }
  local_38 = (MppBuffer)0x0;
  lVar14 = *(long *)((long)hal + 0x18);
  pvVar3 = (task->dec).syntax.data;
  if ((RVar6 & 1) != 0) {
    _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x108,
               "hal_vp8d_dct_partition_cfg");
  }
  mpp_buf_slot_get_prop(*hal,(task->dec).input,SLOT_BUFFER,&local_38);
  iVar4 = mpp_buffer_get_fd_with_caller(local_38,"hal_vp8d_dct_partition_cfg");
  *(int *)(lVar14 + 0x244) = iVar4;
  if (*(RK_U32 *)((long)pvVar3 + 0x494) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),0x91,*(RK_U32 *)((long)pvVar3 + 0x494));
  }
  *(uint *)(lVar14 + 0x1e8) =
       *(uint *)(lVar14 + 0x1e8) & 0xff03ffff | (*(uint *)((long)pvVar3 + 0x4bc) & 0x3f) << 0x12;
  uVar5 = 0;
  iVar26 = 0;
  if (*(int *)((long)pvVar3 + 0x488) == 2) {
    iVar26 = 7;
    if ((*(byte *)((long)pvVar3 + 0xd) & 1) != 0) {
      iVar26 = 0;
    }
  }
  *(uint *)(lVar14 + 0xcc) =
       ((*(int *)((long)pvVar3 + 0x4c4) + *(int *)((long)pvVar3 + 0x4c0)) -
       *(int *)((long)pvVar3 + 0x498)) + (*(int *)((long)pvVar3 + 0x498) + iVar26 & 7U) +
       (3 << (*(byte *)((long)pvVar3 + 0x27) & 0x1f)) + 0xfffffd & 0xffffff |
       (uint)*(byte *)(lVar14 + 0xcf) << 0x18;
  uVar25 = (uint)*(byte *)(lVar14 + 499) << 0x18;
  uVar16 = ((*(int *)((long)pvVar3 + 0x4c8) + iVar26 + *(int *)((long)pvVar3 + 0x4c0)) -
           *(int *)((long)pvVar3 + 0x494)) + 1U & 0xffffff;
  *(uint *)(lVar14 + 0x1f0) = uVar16 | uVar25;
  local_40 = (uint *)(lVar14 + 0x1e8);
  *(uint *)(lVar14 + 0x1f0) =
       (uVar16 | uVar25 & 0xf0ffffff |
       -0x1000000 << (*(byte *)((long)pvVar3 + 0x27) & 0x1f) & 0xf000000U) ^ 0xf000000;
  puVar1 = (uint *)(lVar14 + 600);
  local_48 = (uint *)(lVar14 + 0x1e4);
  do {
    if (uVar5 >> (*(byte *)((long)pvVar3 + 0x27) & 0x1f) != 0) {
      if ((hal_vp8d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x154,
                   "hal_vp8d_dct_partition_cfg");
      }
      *(byte *)((long)pvVar2 + 0xe4) = *(byte *)((long)pvVar2 + 0xe4) | 1;
      mpp_buffer_sync_end_f(*(MppBuffer *)((long)hal + 0x30),0,"hal_vp8d_vdpu2_gen_regs");
      mpp_buffer_sync_end_f(*(MppBuffer *)((long)hal + 0x38),0,"hal_vp8d_vdpu2_gen_regs");
      if ((hal_vp8d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x253,
                   "hal_vp8d_vdpu2_gen_regs");
      }
      return MPP_OK;
    }
    uVar16 = *(int *)((long)pvVar3 + (ulong)uVar5 * 4 + 0x498) + iVar26;
    uVar25 = uVar16 & 0xfffffff8;
    if (uVar5 == 0) {
      *(int *)(lVar14 + 0x100) = iVar4;
      if (uVar25 != 0) {
        mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),0x40,uVar25);
      }
      uVar16 = uVar16 * 0x20000000;
      uVar25 = 0x3ffffff;
      puVar15 = local_40;
LAB_001f4f26:
      *puVar15 = uVar25 & *puVar15 | uVar16;
    }
    else {
      if (uVar5 < 6) {
        *(int *)(lVar14 + 0x230 + (ulong)(uVar5 - 1) * 4) = iVar4;
        iVar17 = 0x8b;
      }
      else {
        *(int *)(lVar14 + 0x248 + (ulong)(uVar5 - 6) * 4) = iVar4;
        iVar17 = 0x8c;
      }
      if (uVar25 != 0) {
        mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),iVar17 + uVar5,uVar25);
      }
      if (uVar5 - 1 < 7) {
        uVar25 = uVar16 & 7;
        puVar15 = puVar1;
        switch(uVar5) {
        case 1:
          uVar16 = uVar16 * 0x20000000;
          uVar25 = 0x3ffffff;
          puVar15 = local_48;
          break;
        case 2:
          uVar16 = uVar25 << 0x17;
          uVar25 = 0xfc0fffff;
          puVar15 = local_48;
          break;
        case 3:
          uVar16 = uVar25 << 0x1b;
          uVar25 = 0xc0ffffff;
          break;
        case 4:
          uVar16 = uVar25 << 0x15;
          uVar25 = 0xff03ffff;
          break;
        case 5:
          uVar16 = uVar25 << 0xf;
          uVar25 = 0xfffc0fff;
          break;
        case 6:
          uVar16 = uVar25 << 9;
          uVar25 = 0xfffff03f;
          break;
        case 7:
          uVar16 = uVar25 << 3;
          uVar25 = 0xffffffc0;
        }
        goto LAB_001f4f26;
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

MPP_RET hal_vp8d_vdpu2_gen_regs(void* hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    RK_U32 mb_width = 0, mb_height = 0;
    MppBuffer framebuf = NULL;
    RK_U8 *segmap_ptr = NULL;
    RK_U8 *probe_ptr = NULL;
    VP8DHalContext_t *ctx = (VP8DHalContext_t *)hal;
    VP8DRegSet_t *regs = (VP8DRegSet_t *)ctx->regs;
    DXVA_PicParams_VP8 *pic_param = (DXVA_PicParams_VP8 *)task->dec.syntax.data;

    FUN_T("FUN_IN");

    hal_vp8_init_hwcfg(ctx);
    mb_width = (pic_param->width + 15) >> 4;
    mb_height = (pic_param->height + 15) >> 4;
    // mpp_log("mb_width = %d mb_height = %d", mb_width, mb_height);
    regs->reg120.sw_pic_mb_width = mb_width & 0x1FF;
    regs->reg120.sw_pic_mb_hight_p =  mb_height & 0xFF;
    regs->reg120.sw_pic_mb_w_ext = mb_width >> 9;
    regs->reg120.sw_pic_mb_h_ext = mb_height >> 8;

    if (!pic_param->frame_type) {
        segmap_ptr = mpp_buffer_get_ptr(ctx->seg_map);
        if (NULL != segmap_ptr) {
            memset(segmap_ptr, 0, VP8D_MAX_SEGMAP_SIZE);
        }
    }

    probe_ptr = mpp_buffer_get_ptr(ctx->probe_table);
    if (NULL != probe_ptr) {
        hal_vp8hw_asic_probe_update(pic_param, probe_ptr);
    }
    mpp_buf_slot_get_prop(ctx->frame_slots, pic_param->CurrPic.Index7Bits, SLOT_BUFFER, &framebuf);
    regs->reg63_cur_pic_base = mpp_buffer_get_fd(framebuf);
    if (!pic_param->frame_type) { //key frame

        regs->reg131_ref0_base = regs->reg63_cur_pic_base;

        mpp_dev_set_reg_offset(ctx->dev, 131, mb_width * mb_height);
    } else if (pic_param->lst_fb_idx.Index7Bits < 0x7f) { //config ref0 base
        mpp_buf_slot_get_prop(ctx->frame_slots, pic_param->lst_fb_idx.Index7Bits, SLOT_BUFFER, &framebuf);
        regs->reg131_ref0_base = mpp_buffer_get_fd(framebuf);
    } else {
        regs->reg131_ref0_base = regs->reg63_cur_pic_base;
    }

    /* golden reference */
    if (pic_param->gld_fb_idx.Index7Bits < 0x7f) {
        mpp_buf_slot_get_prop(ctx->frame_slots, pic_param->gld_fb_idx.Index7Bits, SLOT_BUFFER, &framebuf);
        regs->reg136_golden_ref_base = mpp_buffer_get_fd(framebuf);
    } else {
        regs->reg136_golden_ref_base = regs->reg63_cur_pic_base;
    }

    regs->reg136_golden_ref_base = regs->reg136_golden_ref_base;
    if (pic_param->ref_frame_sign_bias_golden) {
        mpp_dev_set_reg_offset(ctx->dev, 136, pic_param->ref_frame_sign_bias_golden);
    }

    /* alternate reference */
    if (pic_param->alt_fb_idx.Index7Bits < 0x7f) {
        mpp_buf_slot_get_prop(ctx->frame_slots, pic_param->alt_fb_idx.Index7Bits, SLOT_BUFFER, &framebuf);
        regs->reg137.alternate_ref_base = mpp_buffer_get_fd(framebuf);
    } else {
        regs->reg137.alternate_ref_base = regs->reg63_cur_pic_base;
    }

    regs->reg137.alternate_ref_base = regs->reg137.alternate_ref_base;
    if (pic_param->ref_frame_sign_bias_altref)
        mpp_dev_set_reg_offset(ctx->dev, 137, pic_param->ref_frame_sign_bias_altref);

    regs->reg149_segment_map_base = regs->reg149_segment_map_base;
    if (pic_param->stVP8Segments.segmentation_enabled + (pic_param->stVP8Segments.update_mb_segmentation_map << 1))
        mpp_dev_set_reg_offset(ctx->dev, 149, pic_param->stVP8Segments.segmentation_enabled
                               + (pic_param->stVP8Segments.update_mb_segmentation_map << 1));

    regs->reg57_enable_ctrl.sw_pic_inter_e = pic_param->frame_type;
    regs->reg50_dec_ctrl.sw_skip_mode = !pic_param->mb_no_coeff_skip;

    if (!pic_param->stVP8Segments.segmentation_enabled) {
        regs->reg129.sw_filt_level_0 = pic_param->filter_level;
    } else if (pic_param->stVP8Segments.update_mb_segmentation_data) {
        regs->reg129.sw_filt_level_0 = pic_param->stVP8Segments.segment_feature_data[1][0];
        regs->reg129.sw_filt_level_1 = pic_param->stVP8Segments.segment_feature_data[1][1];
        regs->reg129.sw_filt_level_2 = pic_param->stVP8Segments.segment_feature_data[1][2];
        regs->reg129.sw_filt_level_3 = pic_param->stVP8Segments.segment_feature_data[1][3];
    } else {
        regs->reg129.sw_filt_level_0 = CLIP3(0, 63, (RK_S32)pic_param->filter_level + pic_param->stVP8Segments.segment_feature_data[1][0]);
        regs->reg129.sw_filt_level_1 = CLIP3(0, 63, (RK_S32)pic_param->filter_level + pic_param->stVP8Segments.segment_feature_data[1][1]);
        regs->reg129.sw_filt_level_2 = CLIP3(0, 63, (RK_S32)pic_param->filter_level + pic_param->stVP8Segments.segment_feature_data[1][2]);
        regs->reg129.sw_filt_level_3 = CLIP3(0, 63, (RK_S32)pic_param->filter_level + pic_param->stVP8Segments.segment_feature_data[1][3]);
    }

    regs->reg132.sw_filt_type = pic_param->filter_type;
    regs->reg132.sw_filt_sharpness = pic_param->sharpness;

    if (pic_param->filter_level == 0) {
        regs->reg50_dec_ctrl.sw_filtering_dis = 1;
    }

    if (pic_param->version != 3) {
        regs->reg121.sw_romain_mv = 1;
    }

    if (pic_param->decMode == VP8HWD_VP8 && (pic_param->version & 0x3)) {
        regs->reg121.sw_eable_bilinear = 1;
    }
    regs->reg122.sw_boolean_value = pic_param->bool_value;
    regs->reg122.sw_boolean_range = pic_param->bool_range;

    {
        if (!pic_param->stVP8Segments.segmentation_enabled)
            regs->reg130.sw_quant_0 = pic_param->y1ac_delta_q;
        else if (pic_param->stVP8Segments.update_mb_segmentation_data) { /* absolute mode */
            regs->reg130.sw_quant_0 = pic_param->stVP8Segments.segment_feature_data[0][0];
            regs->reg130.sw_quant_1 = pic_param->stVP8Segments.segment_feature_data[0][1];
            regs->reg151.sw_quant_2 = pic_param->stVP8Segments.segment_feature_data[0][2];
            regs->reg151.sw_quant_3 = pic_param->stVP8Segments.segment_feature_data[0][3];
        } else { /* delta mode */
            regs->reg130.sw_quant_0 = CLIP3(0, 127, pic_param->y1ac_delta_q + pic_param->stVP8Segments.segment_feature_data[0][0]);
            regs->reg130.sw_quant_1 = CLIP3(0, 127, pic_param->y1ac_delta_q + pic_param->stVP8Segments.segment_feature_data[0][1]);
            regs->reg151.sw_quant_2 = CLIP3(0, 127, pic_param->y1ac_delta_q + pic_param->stVP8Segments.segment_feature_data[0][2]);
            regs->reg151.sw_quant_3 = CLIP3(0, 127, pic_param->y1ac_delta_q + pic_param->stVP8Segments.segment_feature_data[0][3]);
        }

        regs->reg130.sw_quant_delta_0 = pic_param->y1dc_delta_q;
        regs->reg130.sw_quant_delta_1 = pic_param->y2dc_delta_q;
        regs->reg151.sw_quant_delta_2 = pic_param->y2ac_delta_q;
        regs->reg151.sw_quant_delta_3 = pic_param->uvdc_delta_q;
        regs->reg152.sw_quant_delta_4 = pic_param->uvac_delta_q;

        if (pic_param->mode_ref_lf_delta_enabled) {
            regs->reg133.sw_filt_ref_adj_0 = pic_param->ref_lf_deltas[0];
            regs->reg133.sw_filt_ref_adj_1 = pic_param->ref_lf_deltas[1];
            regs->reg133.sw_filt_ref_adj_2 = pic_param->ref_lf_deltas[2];
            regs->reg133.sw_filt_ref_adj_3 = pic_param->ref_lf_deltas[3];
            regs->reg132.sw_filt_mb_adj_0  = pic_param->mode_lf_deltas[0];
            regs->reg132.sw_filt_mb_adj_1  = pic_param->mode_lf_deltas[1];
            regs->reg132.sw_filt_mb_adj_2  = pic_param->mode_lf_deltas[2];
            regs->reg132.sw_filt_mb_adj_3  = pic_param->mode_lf_deltas[3];
        }

    }

    if ((pic_param->version & 0x3) == 0)
        hal_vp8d_pre_filter_tap_set(ctx);

    hal_vp8d_dct_partition_cfg(ctx, task);
    regs->reg57_enable_ctrl.sw_dec_e = 1;

    mpp_buffer_sync_end(ctx->probe_table);
    mpp_buffer_sync_end(ctx->seg_map);

    FUN_T("FUN_OUT");
    return ret;
}